

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dSFMT.c
# Opt level: O0

void dsfmt_gen_rand_all(dsfmt_t *dsfmt)

{
  undefined1 local_28 [8];
  w128_t lung;
  dsfmt_t *pdStack_10;
  int i;
  dsfmt_t *dsfmt_local;
  
  local_28 = (undefined1  [8])dsfmt->status[0xbf].u[0];
  lung.u[0] = *(uint64_t *)((long)dsfmt->status + 0xbf8);
  pdStack_10 = dsfmt;
  do_recursion(dsfmt->status,dsfmt->status,dsfmt->status + 0x75,(w128_t *)local_28);
  for (lung.u32[3] = 1; (int)lung.u32[3] < 0x4a; lung.u32[3] = lung.u32[3] + 1) {
    do_recursion(pdStack_10->status + (int)lung.u32[3],pdStack_10->status + (int)lung.u32[3],
                 pdStack_10->status + (int)(lung.u32[3] + 0x75),(w128_t *)local_28);
  }
  for (; (int)lung.u32[3] < 0xbf; lung.u32[3] = lung.u32[3] + 1) {
    do_recursion(pdStack_10->status + (int)lung.u32[3],pdStack_10->status + (int)lung.u32[3],
                 pdStack_10->status + (int)(lung.u32[3] - 0x4a),(w128_t *)local_28);
  }
  pdStack_10->status[0xbf].u[0] = (uint64_t)local_28;
  *(uint64_t *)((long)pdStack_10->status + 0xbf8) = lung.u[0];
  return;
}

Assistant:

void dsfmt_gen_rand_all(dsfmt_t* dsfmt)
{
	int i;
	w128_t lung;

	lung = dsfmt->status[DSFMT_N];
	do_recursion(&dsfmt->status[0], &dsfmt->status[0],
	             &dsfmt->status[DSFMT_POS1], &lung);
	for (i = 1; i < DSFMT_N - DSFMT_POS1; i++)
	{
		do_recursion(&dsfmt->status[i], &dsfmt->status[i],
		             &dsfmt->status[i + DSFMT_POS1], &lung);
	}
	for (; i < DSFMT_N; i++)
	{
		do_recursion(&dsfmt->status[i], &dsfmt->status[i],
		             &dsfmt->status[i + DSFMT_POS1 - DSFMT_N], &lung);
	}
	dsfmt->status[DSFMT_N] = lung;
}